

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O1

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  uint32_t sum [3];
  uint32_t hist [3] [2048];
  uint local_6044 [4];
  uint local_6034 [2047];
  uint auStack_4038 [2048];
  uint auStack_2038 [2050];
  
  uVar3 = (ulong)size;
  memset(local_6044 + 3,0,0x6000);
  if (size != 0) {
    uVar6 = 0;
    do {
      uVar1 = keys_in[uVar6];
      lVar4 = 0;
      puVar5 = local_6044 + 3;
      do {
        puVar5[uVar1 >> ((byte)lVar4 & 0x1f) & 0x7ff] =
             puVar5[uVar1 >> ((byte)lVar4 & 0x1f) & 0x7ff] + 1;
        lVar4 = lVar4 + 0xb;
        puVar5 = puVar5 + 0x800;
      } while (lVar4 != 0x21);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  puVar5 = local_6044 + 3;
  lVar4 = 0;
  do {
    local_6044[lVar4] = *puVar5;
    *puVar5 = 0;
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 0x800;
  } while (lVar4 != 3);
  lVar4 = 1;
  puVar5 = local_6044 + 4;
  do {
    lVar10 = 0;
    puVar8 = puVar5;
    do {
      uVar1 = local_6044[lVar10];
      uVar2 = *puVar8;
      *puVar8 = uVar1;
      local_6044[lVar10] = uVar2 + uVar1;
      lVar10 = lVar10 + 1;
      puVar8 = puVar8 + 0x800;
    } while (lVar10 != 3);
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 1;
  } while (lVar4 != 0x800);
  if (size != 0) {
    uVar6 = 0;
    do {
      uVar1 = keys_in[uVar6];
      uVar9 = (ulong)(uVar1 & 0x7ff);
      uVar2 = local_6044[uVar9 + 3];
      local_6044[uVar9 + 3] = uVar2 + 1;
      keys_temp[uVar2] = uVar1;
      values_temp[uVar2] = values_in[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if (size != 0) {
    uVar6 = 0;
    do {
      uVar1 = keys_temp[uVar6];
      uVar9 = (ulong)(uVar1 >> 9 & 0x1ffc);
      uVar2 = *(uint *)((long)auStack_4038 + uVar9);
      *(uint *)((long)auStack_4038 + uVar9) = uVar2 + 1;
      keys_in[uVar2] = uVar1;
      values_in[uVar2] = values_temp[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if (size != 0) {
    uVar6 = 0;
    do {
      uVar1 = keys_in[uVar6];
      uVar7 = uVar1 >> 0x16;
      uVar2 = auStack_2038[uVar7];
      auStack_2038[uVar7] = uVar2 + 1;
      keys_temp[uVar2] = uVar1;
      values_temp[uVar2] = values_in[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  return 1;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }